

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

int SHA384_512Reset(SHA512Context *context,uint64_t *H0)

{
  int local_24;
  int i;
  uint64_t *H0_local;
  SHA512Context *context_local;
  
  if (context == (SHA512Context *)0x0) {
    context_local._4_4_ = 1;
  }
  else {
    context->Message_Block_Index = 0;
    context->Length_Low = 0;
    context->Length_High = 0;
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      context->Intermediate_Hash[local_24] = H0[local_24];
    }
    context->Computed = 0;
    context->Corrupted = 0;
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int SHA384_512Reset(SHA512Context *context, uint64_t H0[])
#endif /* USE_32BIT_ONLY */
{
    int i;
    if (!context)
        return shaNull;

    context->Message_Block_Index = 0;

#ifdef USE_32BIT_ONLY
    context->Length[0] = context->Length[1] = 0;
    context->Length[2] = context->Length[3] = 0;

    for (i = 0; i < SHA512HashSize / 4; i++)
        context->Intermediate_Hash[i] = H0[i];
#else /* !USE_32BIT_ONLY */
    context->Length_High = context->Length_Low = 0;

    for (i = 0; i < SHA512HashSize / 8; i++)
        context->Intermediate_Hash[i] = H0[i];
#endif /* USE_32BIT_ONLY */

    context->Computed = 0;
    context->Corrupted = 0;

    return shaSuccess;
}